

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

SQBool __thiscall RefTable::Release(RefTable *this,SQObject *obj)

{
  SQUnsignedInteger SVar1;
  long in_RDI;
  bool unaff_retaddr;
  RefNode **in_stack_00000008;
  SQHash *in_stack_00000010;
  SQObjectPtr o;
  RefNode *ref;
  RefNode *prev;
  SQHash mainpos;
  SQObjectPtr *in_stack_ffffffffffffffb0;
  SQObjectPtr local_40;
  RefNode *local_30;
  long local_28;
  long local_20;
  SQBool local_8;
  
  local_30 = Get((RefTable *)o.super_SQObject._unVal.pTable,(SQObject *)o.super_SQObject._0_8_,
                 in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if ((local_30 == (RefNode *)0x0) ||
     (SVar1 = local_30->refs - 1, local_30->refs = SVar1, SVar1 != 0)) {
    local_8 = 0;
  }
  else {
    ::SQObjectPtr::SQObjectPtr(&local_40,&local_30->obj);
    if (local_28 == 0) {
      *(RefNode **)(*(long *)(in_RDI + 0x20) + local_20 * 8) = local_30->next;
    }
    else {
      *(RefNode **)(local_28 + 0x18) = local_30->next;
    }
    local_30->next = *(RefNode **)(in_RDI + 0x18);
    *(RefNode **)(in_RDI + 0x18) = local_30;
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -1;
    ::SQObjectPtr::Null(in_stack_ffffffffffffffb0);
    local_8 = 1;
    ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffffb0);
  }
  return local_8;
}

Assistant:

SQBool RefTable::Release(SQObject &obj)
{
    SQHash mainpos;
    RefNode *prev;
    RefNode *ref = Get(obj,mainpos,&prev,false);
    if(ref) {
        if(--ref->refs == 0) {
            SQObjectPtr o = ref->obj;
            if(prev) {
                prev->next = ref->next;
            }
            else {
                _buckets[mainpos] = ref->next;
            }
            ref->next = _freelist;
            _freelist = ref;
            _slotused--;
            ref->obj.Null();
            //<<FIXME>>test for shrink?
            return SQTrue;
        }
    }
    else {
        assert(0);
    }
    return SQFalse;
}